

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O1

void unpackforblock19(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  
  puVar1 = (ulong *)*pw;
  puVar2 = *pout;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  uVar5 = puVar1[2];
  uVar6 = puVar1[3];
  uVar7 = puVar1[4];
  uVar8 = puVar1[5];
  uVar9 = puVar1[6];
  uVar10 = puVar1[7];
  uVar11 = puVar1[8];
  uVar12 = puVar1[9];
  *pw = (uint8_t *)((long)puVar1 + 0x4c);
  *puVar2 = ((uint)uVar3 & 0x7ffff) + base;
  puVar2[1] = ((uint)(uVar3 >> 0x13) & 0x7ffff) + base;
  uVar13 = (uint)(uVar3 >> 0x20);
  puVar2[2] = (uVar13 >> 6 & 0x7ffff) + base;
  puVar2[3] = ((uint)(uVar4 << 7) & 0x7ffff | uVar13 >> 0x19) + base;
  puVar2[4] = ((uint)(uVar4 >> 0xc) & 0x7ffff) + base;
  puVar2[5] = ((uint)(uVar4 >> 0x1f) & 0x7ffff) + base;
  puVar2[6] = ((uint)(uVar5 << 0xe) & 0x7ffff | (uint)(uVar4 >> 0x32)) + base;
  puVar2[7] = ((uint)(uVar5 >> 5) & 0x7ffff) + base;
  puVar2[8] = ((uint)(uVar5 >> 0x18) & 0x7ffff) + base;
  uVar13 = (uint)(uVar5 >> 0x20);
  puVar2[9] = (uVar13 >> 0xb & 0x7ffff) + base;
  puVar2[10] = ((uint)(uVar6 << 2) & 0x7ffff | uVar13 >> 0x1e) + base;
  puVar2[0xb] = ((uint)(uVar6 >> 0x11) & 0x7ffff) + base;
  uVar13 = (uint)(uVar6 >> 0x20);
  puVar2[0xc] = (uVar13 >> 4 & 0x7ffff) + base;
  puVar2[0xd] = ((uint)(uVar7 << 9) & 0x7ffff | uVar13 >> 0x17) + base;
  puVar2[0xe] = ((uint)(uVar7 >> 10) & 0x7ffff) + base;
  puVar2[0xf] = ((uint)(uVar7 >> 0x1d) & 0x7ffff) + base;
  puVar2[0x10] = ((uint)(uVar8 << 0x10) & 0x7ffff | (uint)(ushort)(uVar7 >> 0x30)) + base;
  puVar2[0x11] = ((uint)(uVar8 >> 3) & 0x7ffff) + base;
  uVar13 = (uint)(uVar8 >> 0x20);
  puVar2[0x12] = ((uint)(uVar8 >> 0x16) & 0x7ffff) + base;
  puVar2[0x13] = (uVar13 >> 9 & 0x7ffff) + base;
  puVar2[0x14] = ((uint)(uVar9 << 4) & 0x7ffff | uVar13 >> 0x1c) + base;
  puVar2[0x15] = ((uint)(uVar9 >> 0xf) & 0x7ffff) + base;
  uVar13 = (uint)(uVar9 >> 0x20);
  puVar2[0x16] = (uVar13 >> 2 & 0x7ffff) + base;
  puVar2[0x17] = ((uint)(uVar10 << 0xb) & 0x7ffff | uVar13 >> 0x15) + base;
  puVar2[0x18] = ((uint)(uVar10 >> 8) & 0x7ffff) + base;
  puVar2[0x19] = ((uint)(uVar10 >> 0x1b) & 0x7ffff) + base;
  puVar2[0x1a] = ((uint)(uVar11 << 0x12) & 0x7ffff | (uint)(uVar10 >> 0x2e)) + base;
  puVar2[0x1b] = ((uint)(uVar11 >> 1) & 0x7ffff) + base;
  puVar2[0x1c] = ((uint)(uVar11 >> 0x14) & 0x7ffff) + base;
  uVar13 = (uint)(uVar11 >> 0x20);
  puVar2[0x1d] = (uVar13 >> 7 & 0x7ffff) + base;
  puVar2[0x1e] = ((uint)(uVar12 << 6) & 0x7ffff | uVar13 >> 0x1a) + base;
  puVar2[0x1f] = ((uint)(uVar12 >> 0xd) & 0x7ffff) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock19(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(524287);
  /* we are going to access  10 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  *pw += 76; /* we used up 76 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 19) & mask);
  out[2] = base + (uint32_t)((w0 >> 38) & mask);
  out[3] = base + (uint32_t)(((w0 >> 57) | (w1 << 7)) & mask);
  out[4] = base + (uint32_t)((w1 >> 12) & mask);
  out[5] = base + (uint32_t)((w1 >> 31) & mask);
  out[6] = base + (uint32_t)(((w1 >> 50) | (w2 << 14)) & mask);
  out[7] = base + (uint32_t)((w2 >> 5) & mask);
  out[8] = base + (uint32_t)((w2 >> 24) & mask);
  out[9] = base + (uint32_t)((w2 >> 43) & mask);
  out[10] = base + (uint32_t)(((w2 >> 62) | (w3 << 2)) & mask);
  out[11] = base + (uint32_t)((w3 >> 17) & mask);
  out[12] = base + (uint32_t)((w3 >> 36) & mask);
  out[13] = base + (uint32_t)(((w3 >> 55) | (w4 << 9)) & mask);
  out[14] = base + (uint32_t)((w4 >> 10) & mask);
  out[15] = base + (uint32_t)((w4 >> 29) & mask);
  out[16] = base + (uint32_t)(((w4 >> 48) | (w5 << 16)) & mask);
  out[17] = base + (uint32_t)((w5 >> 3) & mask);
  out[18] = base + (uint32_t)((w5 >> 22) & mask);
  out[19] = base + (uint32_t)((w5 >> 41) & mask);
  out[20] = base + (uint32_t)(((w5 >> 60) | (w6 << 4)) & mask);
  out[21] = base + (uint32_t)((w6 >> 15) & mask);
  out[22] = base + (uint32_t)((w6 >> 34) & mask);
  out[23] = base + (uint32_t)(((w6 >> 53) | (w7 << 11)) & mask);
  out[24] = base + (uint32_t)((w7 >> 8) & mask);
  out[25] = base + (uint32_t)((w7 >> 27) & mask);
  out[26] = base + (uint32_t)(((w7 >> 46) | (w8 << 18)) & mask);
  out[27] = base + (uint32_t)((w8 >> 1) & mask);
  out[28] = base + (uint32_t)((w8 >> 20) & mask);
  out[29] = base + (uint32_t)((w8 >> 39) & mask);
  out[30] = base + (uint32_t)(((w8 >> 58) | (w9 << 6)) & mask);
  out[31] = base + (uint32_t)((w9 >> 13) & mask);
  *pout += 32; /* we wrote 32 32-bit integers */
}